

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

Am_Object Class_Create(Am_String *name)

{
  int iVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_String *in_RSI;
  Am_Value_List l;
  Am_Object local_50;
  Am_String local_48;
  Am_Value_List local_40 [16];
  Am_Value_List local_30 [16];
  
  Am_String::Am_String(&local_48,in_RSI);
  Am_Gesture_Trainer::Get_Examples((Am_String_Data *)local_40);
  Example_Create_List(local_30);
  Am_Value_List::~Am_Value_List(local_40);
  Am_String::~Am_String(&local_48);
  Am_Object::Create((char *)&local_50);
  uVar2 = Am_Object::Set((ushort)&local_50,(Am_String *)(ulong)(ushort)CLASS_NAME,(ulong)in_RSI);
  iVar1 = CLASS_EXAMPLES;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_30);
  pAVar4 = (Am_Object *)Am_Object::Add(uVar2,(Am_Wrapper *)(ulong)(iVar1 & 0xffff),(ulong)pAVar3);
  Am_Object::Am_Object((Am_Object *)name,pAVar4);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(local_30);
  return (Am_Object)(Am_Object_Data *)name;
}

Assistant:

Am_Object
Class_Create(Am_String name)
{
  Am_Value_List l = Example_Create_List(trainer.Get_Examples(name));
  Am_Object cls = Class.Create().Set(CLASS_NAME, name).Add(CLASS_EXAMPLES, l);

  return cls;
}